

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SemanticAnalyzer.cpp
# Opt level: O3

void __thiscall
SemanticAnalyzerRun::onEnterAssignStatementAstNode
          (SemanticAnalyzerRun *this,AssignStatementAstNode *node)

{
  string local_68;
  undefined1 local_48 [8];
  optional<VariableDefinition> originalDeclare;
  
  Scope::find((optional<VariableDefinition> *)local_48,
              (this->currentScope).super___shared_ptr<Scope,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
              &((node->identifier).super___shared_ptr<Token,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
               value,false);
  if (originalDeclare.super__Optional_base<VariableDefinition,_false,_false>._M_payload.
      super__Optional_payload<VariableDefinition,_true,_false,_false>.
      super__Optional_payload_base<VariableDefinition>._M_payload._M_value.isFullyBound == false) {
    local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_68,"No local declaration found for identifier.","");
    reportError(this,&node->identifier,&local_68);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p != &local_68.field_2) {
      operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
    }
  }
  if (((originalDeclare.super__Optional_base<VariableDefinition,_false,_false>._M_payload.
        super__Optional_payload<VariableDefinition,_true,_false,_false>.
        super__Optional_payload_base<VariableDefinition>._M_payload._M_value.isFullyBound & 1U) != 0
      ) && (originalDeclare.super__Optional_base<VariableDefinition,_false,_false>._M_payload.
            super__Optional_payload<VariableDefinition,_true,_false,_false>.
            super__Optional_payload_base<VariableDefinition>._M_payload._M_value.isFullyBound =
                 false,
           originalDeclare.super__Optional_base<VariableDefinition,_false,_false>._M_payload.
           super__Optional_payload<VariableDefinition,_true,_false,_false>.
           super__Optional_payload_base<VariableDefinition>._M_payload._M_value.token.
           super___shared_ptr<Token,_(__gnu_cxx::_Lock_policy)2>._M_ptr != (element_type *)0x0)) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               originalDeclare.super__Optional_base<VariableDefinition,_false,_false>._M_payload.
               super__Optional_payload<VariableDefinition,_true,_false,_false>.
               super__Optional_payload_base<VariableDefinition>._M_payload._M_value.token.
               super___shared_ptr<Token,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  }
  return;
}

Assistant:

void onEnterAssignStatementAstNode(AssignStatementAstNode* node) noexcept override {
    auto originalDeclare = this->currentScope->find(node->identifier->value, false);
    if (originalDeclare == std::nullopt) {
      this->reportError(node->identifier, "No local declaration found for identifier.");
    }
  }